

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<unsigned_short>::clear(PropertyT<unsigned_short> *this)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_28;
  PropertyT<unsigned_short> *local_10;
  PropertyT<unsigned_short> *this_local;
  
  local_10 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->data_);
  memset(&local_28,0,0x18);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_28);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::swap(&local_28,&this->data_);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_28);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }